

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O3

int __thiscall
anon_unknown.dwarf_38a::NinjaMain::ToolUrtle(NinjaMain *this,Options *options,int argc,char **argv)

{
  char cVar1;
  char *p;
  char *pcVar2;
  int iVar3;
  
  iVar3 = 0;
  pcVar2 = 
  " 13 ,3;2!2;\n8 ,;<11!;\n5 `\'<10!(2`\'2!\n11 ,6;, `\\. `\\9 .,c13$ec,.\n6 ,2;11!>; `. ,;!2> .e8$2\".2 \"?7$e.\n <:<8!\'` 2.3,.2` ,3!\' ;,(?7\";2!2\'<; `?6$PF ,;,\n2 `\'4!8;<!3\'`2 3! ;,`\'2`2\'3!;4!`2.`!;2 3,2 .<!2\'`).\n5 3`5\'2`9 `!2 `4!><3;5! J2$b,`!>;2!:2!`,d?b`!>\n26 `\'-;,(<9!> $F3 )3.:!.2 d\"2 ) !>\n30 7`2\'<3!- \"=-=\'5 .2 `2-=\",!>\n25 .ze9$er2 .,cd16$bc.\'\n22 .e14$,26$.\n21 z45$c .\n20 J50$c\n20 14$P\"`?34$b\n20 14$ dbc `2\"?22$?7$c\n20 ?18$c.6 4\"8?4\" c8$P\n9 .2,.8 \"20$c.3 ._14 J9$\n .2,2c9$bec,.2 `?21$c.3`4%,3%,3 c8$P\"\n22$c2 2\"?21$bc2,.2` .2,c7$P2\",cb\n23$b bc,.2\"2?14$2F2\"5?2\",J5$P\" ,zd3$\n24$ ?$3?%3 `2\"2?12$bcucd3$P3\"2 2=7$\n23$P\" ,3;<5!>2;,. `4\"6?2\"2 ,9;, `\"?2$\n"
  ;
  cVar1 = ' ';
  do {
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar3 = (int)cVar1 + iVar3 * 10 + -0x30;
    }
    else {
      if (iVar3 < 2) {
        iVar3 = 1;
      }
      do {
        putchar((int)cVar1);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      iVar3 = 0;
    }
    cVar1 = pcVar2[1];
    pcVar2 = pcVar2 + 1;
  } while (cVar1 != '\0');
  return 0;
}

Assistant:

int NinjaMain::ToolUrtle(const Options* options, int argc, char** argv) {
  // RLE encoded.
  const char* urtle =
" 13 ,3;2!2;\n8 ,;<11!;\n5 `'<10!(2`'2!\n11 ,6;, `\\. `\\9 .,c13$ec,.\n6 "
",2;11!>; `. ,;!2> .e8$2\".2 \"?7$e.\n <:<8!'` 2.3,.2` ,3!' ;,(?7\";2!2'<"
"; `?6$PF ,;,\n2 `'4!8;<!3'`2 3! ;,`'2`2'3!;4!`2.`!;2 3,2 .<!2'`).\n5 3`5"
"'2`9 `!2 `4!><3;5! J2$b,`!>;2!:2!`,d?b`!>\n26 `'-;,(<9!> $F3 )3.:!.2 d\""
"2 ) !>\n30 7`2'<3!- \"=-='5 .2 `2-=\",!>\n25 .ze9$er2 .,cd16$bc.'\n22 .e"
"14$,26$.\n21 z45$c .\n20 J50$c\n20 14$P\"`?34$b\n20 14$ dbc `2\"?22$?7$c"
"\n20 ?18$c.6 4\"8?4\" c8$P\n9 .2,.8 \"20$c.3 ._14 J9$\n .2,2c9$bec,.2 `?"
"21$c.3`4%,3%,3 c8$P\"\n22$c2 2\"?21$bc2,.2` .2,c7$P2\",cb\n23$b bc,.2\"2"
"?14$2F2\"5?2\",J5$P\" ,zd3$\n24$ ?$3?%3 `2\"2?12$bcucd3$P3\"2 2=7$\n23$P"
"\" ,3;<5!>2;,. `4\"6?2\"2 ,9;, `\"?2$\n";
  int count = 0;
  for (const char* p = urtle; *p; p++) {
    if ('0' <= *p && *p <= '9') {
      count = count*10 + *p - '0';
    } else {
      for (int i = 0; i < max(count, 1); ++i)
        printf("%c", *p);
      count = 0;
    }
  }
  return 0;
}